

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

void __thiscall TPZMatrix<long_double>::Diagonal(TPZMatrix<long_double> *this,longdouble val)

{
  _func_int **pp_Var1;
  longdouble *plVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  longdouble local_48;
  longdouble local_38;
  
  local_38 = val;
  lVar4 = (this->super_TPZBaseMatrix).fCol;
  if (lVar4 != (this->super_TPZBaseMatrix).fRow) {
    Error("Diagonal (TPZMatrix<>*) <TPZMatrix<>must be square>",(char *)0x0);
    lVar4 = (this->super_TPZBaseMatrix).fRow;
  }
  if (0 < lVar4) {
    lVar3 = (this->super_TPZBaseMatrix).fCol;
    lVar5 = 0;
    do {
      if (0 < lVar3) {
        lVar4 = 0;
        do {
          if (lVar5 == lVar4) {
            pp_Var1 = (this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable;
            plVar2 = &local_38;
            lVar3 = lVar5;
          }
          else {
            local_48 = (longdouble)0;
            pp_Var1 = (this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable;
            plVar2 = &local_48;
            lVar3 = lVar4;
          }
          (*pp_Var1[0x23])(this,lVar5,lVar3,plVar2);
          lVar4 = lVar4 + 1;
          lVar3 = (this->super_TPZBaseMatrix).fCol;
        } while (lVar4 < lVar3);
        lVar4 = (this->super_TPZBaseMatrix).fRow;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < lVar4);
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::Diagonal(TVar val) {
    
    if ( Cols() != Rows() ) {
        Error( "Diagonal (TPZMatrix<>*) <TPZMatrix<>must be square>" );
    }
    for ( int64_t row = 0; row < Rows(); row++) {
        for ( int64_t col = 0; col < Cols(); col++ ) {
            (row == col)? PutVal(row,col,val):PutVal(row,col,0.);
        }
    }
}